

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O1

int weight_cap(void)

{
  ushort uVar1;
  schar sVar2;
  schar sVar3;
  boolean bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  sVar2 = acurrstr();
  sVar3 = acurr(4);
  lVar5 = ((long)sVar3 + (long)sVar2) * 0x19 + 0x32;
  lVar7 = lVar5;
  if ((u.umonnum != u.umonster) && (lVar7 = 1000, (youmonst.data)->mlet != '\x0e')) {
    uVar1 = (youmonst.data)->cwt;
    if ((ulong)uVar1 == 0) {
      lVar7 = (long)(lVar5 * (ulong)(youmonst.data)->msize) / 2;
    }
    else if ((0x5aa < uVar1) || (lVar7 = lVar5, ((youmonst.data)->mflags2 & 0x4000000) == 0)) {
      lVar7 = (long)(lVar5 * (ulong)uVar1) / 0x5aa;
    }
  }
  lVar5 = 1000;
  if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
       ((youmonst.data)->mlet != '\x05')) &&
      (bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar4 == '\0')) &&
     ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags2 & 0x4000000) == 0)))) {
    lVar6 = 1000;
    if (lVar7 < 1000) {
      lVar6 = lVar7;
    }
    if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
      lVar7 = lVar6 + -100;
      if ((u.uprops[0x20].extrinsic >> 0x11 & 1) == 0) {
        lVar7 = lVar6;
      }
      lVar6 = lVar7 + -100;
      if ((u.uprops[0x20].extrinsic >> 0x12 & 1) == 0) {
        lVar6 = lVar7;
      }
    }
    lVar5 = 0;
    if (0 < lVar6) {
      lVar5 = lVar6;
    }
  }
  return (int)lVar5;
}

Assistant:

int weight_cap(void)
{
	long carrcap;

	carrcap = 25*(ACURRSTR + ACURR(A_CON)) + 50;
	if (Upolyd) {
		/* consistent with can_carry() in mon.c */
		if (youmonst.data->mlet == S_NYMPH)
			carrcap = MAX_CARR_CAP;
		else if (!youmonst.data->cwt)
			carrcap = (carrcap * (long)youmonst.data->msize) / MZ_HUMAN;
		else if (!strongmonst(youmonst.data)
			|| (strongmonst(youmonst.data) && (youmonst.data->cwt > WT_HUMAN)))
			carrcap = (carrcap * (long)youmonst.data->cwt / WT_HUMAN);
	}

	if (Levitation || Is_airlevel(&u.uz)    /* pugh@cornell */
			|| (u.usteed && strongmonst(u.usteed->data)))
		carrcap = MAX_CARR_CAP;
	else {
		if (carrcap > MAX_CARR_CAP) carrcap = MAX_CARR_CAP;
		if (!Flying) {
			if (EWounded_legs & LEFT_SIDE) carrcap -= 100;
			if (EWounded_legs & RIGHT_SIDE) carrcap -= 100;
		}
		if (carrcap < 0) carrcap = 0;
	}
	return (int) carrcap;
}